

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampPerAxisCase3D::verifyImage
          (TextureBorderClampPerAxisCase3D *this,Surface *renderedFrame,
          ReferenceParams *samplerParams)

{
  Vector<int,_4> *this_00;
  int iVar1;
  int iVar2;
  RenderTarget *this_01;
  PixelFormat *pPVar3;
  Texture3D *pTVar4;
  Texture3D *pTVar5;
  reference pvVar6;
  qpWatchDog *watchDog;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  Texture3DView TVar9;
  allocator<char> local_6a9;
  string local_6a8;
  allocator<char> local_681;
  string local_680;
  LogImage local_660;
  allocator<char> local_5c9;
  string local_5c8;
  allocator<char> local_5a1;
  string local_5a0;
  LogImage local_580;
  allocator<char> local_4e9;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  LogImage local_4a0;
  allocator<char> local_409;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0;
  LogImageSet local_3c0;
  MessageBuilder local_380;
  Texture3DView local_200;
  PixelBufferAccess local_1f0;
  ConstPixelBufferAccess local_1c8;
  ConstPixelBufferAccess local_1a0;
  Texture3DView local_178;
  SurfaceAccess local_168;
  float local_148;
  Vector<int,_3> local_144;
  Vector<int,_3> local_138;
  Vector<float,_4> local_12c;
  tcu local_11c [8];
  float afStack_114 [2];
  int local_10c;
  undefined1 auStack_108 [4];
  int numFailedPixels;
  LookupPrecision lookupPrecision;
  LodPrecision lodPrecision;
  undefined1 local_c0 [8];
  Surface errorMask;
  Surface reference;
  Vector<int,_4> local_7c;
  TextureTestUtil local_6c [16];
  tcu local_5c [16];
  undefined1 local_4c [8];
  IVec4 colorBits;
  int colorErrorBits;
  PixelFormat pixelFormat;
  ReferenceParams *samplerParams_local;
  Surface *renderedFrame_local;
  TextureBorderClampPerAxisCase3D *this_local;
  
  this_01 = Context::getRenderTarget((this->super_TestCase).m_context);
  pPVar3 = tcu::RenderTarget::getPixelFormat(this_01);
  colorBits.m_data[3] = pPVar3->redBits;
  unique0x1000071d = pPVar3->greenBits;
  colorBits.m_data[2] = 2;
  glu::TextureTestUtil::getBitsVec(local_6c,(PixelFormat *)(colorBits.m_data + 3));
  tcu::Vector<int,_4>::Vector(&local_7c,2);
  tcu::operator-(local_5c,(Vector<int,_4> *)local_6c,&local_7c);
  this_00 = (Vector<int,_4> *)((long)&reference.m_pixels.m_cap + 4);
  tcu::Vector<int,_4>::Vector(this_00,0);
  tcu::max<int,4>((tcu *)local_4c,(Vector<int,_4> *)local_5c,this_00);
  iVar1 = tcu::Surface::getWidth(renderedFrame);
  iVar2 = tcu::Surface::getHeight(renderedFrame);
  tcu::Surface::Surface((Surface *)&errorMask.m_pixels.m_cap,iVar1,iVar2);
  iVar1 = tcu::Surface::getWidth(renderedFrame);
  iVar2 = tcu::Surface::getHeight(renderedFrame);
  tcu::Surface::Surface((Surface *)local_c0,iVar1,iVar2);
  tcu::LodPrecision::LodPrecision((LodPrecision *)&lookupPrecision.colorMask,RULE_OPENGL);
  tcu::LookupPrecision::LookupPrecision((LookupPrecision *)auStack_108);
  tcu::computeFixedPointThreshold((tcu *)&local_12c,(IVec4 *)local_4c);
  tcu::operator/(local_11c,&local_12c,&(samplerParams->super_RenderParams).colorScale);
  lookupPrecision.uvwBits.m_data._4_8_ = local_11c;
  lookupPrecision.colorThreshold.m_data[0] = afStack_114[0];
  lookupPrecision.colorThreshold.m_data[1] = afStack_114[1];
  tcu::Vector<int,_3>::Vector(&local_138,0x14,0x14,0);
  lookupPrecision.coordBits.m_data[0] = local_138.m_data[2];
  auStack_108 = (undefined1  [4])local_138.m_data[0];
  numFailedPixels = local_138.m_data[1];
  tcu::Vector<int,_3>::Vector(&local_144,5,5,0);
  lookupPrecision.uvwBits.m_data[0] = local_144.m_data[2];
  lookupPrecision.coordBits.m_data[1] = local_144.m_data[0];
  lookupPrecision.coordBits.m_data[2] = local_144.m_data[1];
  glu::TextureTestUtil::getCompareMask
            ((TextureTestUtil *)&local_148,(PixelFormat *)(colorBits.m_data + 3));
  lookupPrecision.colorThreshold.m_data[2] = local_148;
  tcu::SurfaceAccess::SurfaceAccess
            (&local_168,(Surface *)&errorMask.m_pixels.m_cap,(PixelFormat *)(colorBits.m_data + 3));
  pTVar4 = de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::operator->
                     (&(this->m_texture).
                       super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>);
  pTVar5 = glu::Texture3D::getRefTexture(pTVar4);
  TVar9 = tcu::Texture3D::operator_cast_to_Texture3DView(pTVar5);
  local_178.m_levels = TVar9.m_levels;
  local_178.m_numLevels = TVar9.m_numLevels;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_texCoords,0);
  glu::TextureTestUtil::sampleTexture(&local_168,&local_178,pvVar6,samplerParams);
  tcu::Surface::getAccess(&local_1a0,renderedFrame);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_1c8,(Surface *)&errorMask.m_pixels.m_cap);
  tcu::Surface::getAccess(&local_1f0,(Surface *)local_c0);
  pTVar4 = de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::operator->
                     (&(this->m_texture).
                       super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>);
  pTVar5 = glu::Texture3D::getRefTexture(pTVar4);
  TVar9 = tcu::Texture3D::operator_cast_to_Texture3DView(pTVar5);
  local_200.m_levels = TVar9.m_levels;
  local_200.m_numLevels = TVar9.m_numLevels;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_texCoords,0);
  watchDog = tcu::TestContext::getWatchDog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  local_10c = glu::TextureTestUtil::computeTextureLookupDiff
                        (&local_1a0,&local_1c8,&local_1f0,&local_200,pvVar6,samplerParams,
                         (LookupPrecision *)auStack_108,(LodPrecision *)&lookupPrecision.colorMask,
                         watchDog);
  if (0 < local_10c) {
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_380,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (&local_380,(char (*) [40])"ERROR: Result verification failed, got ");
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_10c);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [17])" invalid pixels!");
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_380);
  }
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"VerifyResult",&local_3e1)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,"Verification result",&local_409);
  tcu::LogImageSet::LogImageSet(&local_3c0,&local_3e0,&local_408);
  pTVar7 = tcu::TestLog::operator<<(pTVar7,&local_3c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"Rendered",&local_4c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e8,"Rendered image",&local_4e9);
  tcu::LogImage::LogImage
            (&local_4a0,&local_4c0,&local_4e8,renderedFrame,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(pTVar7,&local_4a0);
  tcu::LogImage::~LogImage(&local_4a0);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator(&local_4e9);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator(&local_4c1);
  tcu::LogImageSet::~LogImageSet(&local_3c0);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  if (0 < local_10c) {
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a0,"Reference",&local_5a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5c8,"Ideal reference image",&local_5c9);
    tcu::LogImage::LogImage
              (&local_580,&local_5a0,&local_5c8,(Surface *)&errorMask.m_pixels.m_cap,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar7 = tcu::TestLog::operator<<(pTVar7,&local_580);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,"ErrorMask",&local_681);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a8,"Error mask",&local_6a9)
    ;
    tcu::LogImage::LogImage
              (&local_660,&local_680,&local_6a8,(Surface *)local_c0,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(pTVar7,&local_660);
    tcu::LogImage::~LogImage(&local_660);
    std::__cxx11::string::~string((string *)&local_6a8);
    std::allocator<char>::~allocator(&local_6a9);
    std::__cxx11::string::~string((string *)&local_680);
    std::allocator<char>::~allocator(&local_681);
    tcu::LogImage::~LogImage(&local_580);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::allocator<char>::~allocator(&local_5c9);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::allocator<char>::~allocator(&local_5a1);
  }
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(pTVar7,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  if (local_10c == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image verification failed");
  }
  tcu::Surface::~Surface((Surface *)local_c0);
  tcu::Surface::~Surface((Surface *)&errorMask.m_pixels.m_cap);
  return;
}

Assistant:

void TextureBorderClampPerAxisCase3D::verifyImage (const tcu::Surface&							renderedFrame,
												   const glu::TextureTestUtil::ReferenceParams&	samplerParams)
{
	const tcu::PixelFormat			pixelFormat			= m_context.getRenderTarget().getPixelFormat();
	const int						colorErrorBits		= 2;
	const tcu::IVec4				colorBits			= tcu::max(glu::TextureTestUtil::getBitsVec(pixelFormat) - tcu::IVec4(colorErrorBits), tcu::IVec4(0));
	tcu::Surface					reference			(renderedFrame.getWidth(), renderedFrame.getHeight());
	tcu::Surface					errorMask			(renderedFrame.getWidth(), renderedFrame.getHeight());
	tcu::LodPrecision				lodPrecision		(tcu::LodPrecision::RULE_OPENGL);
	tcu::LookupPrecision			lookupPrecision;
	int								numFailedPixels;

	lodPrecision.derivateBits		= 18;
	lodPrecision.lodBits			= 5;

	lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / samplerParams.colorScale;
	lookupPrecision.coordBits		= tcu::IVec3(20,20,0);
	lookupPrecision.uvwBits			= tcu::IVec3(5,5,0);
	lookupPrecision.colorMask		= glu::TextureTestUtil::getCompareMask(pixelFormat);

	glu::TextureTestUtil::sampleTexture(tcu::SurfaceAccess(reference, pixelFormat), m_texture->getRefTexture(), &m_texCoords[0], samplerParams);

	numFailedPixels = glu::TextureTestUtil::computeTextureLookupDiff(renderedFrame.getAccess(), reference.getAccess(), errorMask.getAccess(), m_texture->getRefTexture(),
																	 &m_texCoords[0], samplerParams, lookupPrecision, lodPrecision, m_testCtx.getWatchDog());

	if (numFailedPixels > 0)
		m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: Result verification failed, got " << numFailedPixels << " invalid pixels!" << tcu::TestLog::EndMessage;
	m_testCtx.getLog()	<< tcu::TestLog::ImageSet("VerifyResult", "Verification result")
						<< tcu::TestLog::Image("Rendered", "Rendered image", renderedFrame);
	if (numFailedPixels > 0)
	{
		m_testCtx.getLog()	<< tcu::TestLog::Image("Reference", "Ideal reference image", reference)
							<< tcu::TestLog::Image("ErrorMask", "Error mask", errorMask);
	}
	m_testCtx.getLog() << tcu::TestLog::EndImageSet;

	if (numFailedPixels == 0)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
}